

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CutPerformCheck45(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  If_Par_t *pIVar1;
  int iVar2;
  word t;
  word Func0;
  word local_50;
  If_Grp_t R;
  If_Grp_t local_32;
  
  iVar2 = 0;
  If_CluCheck(&local_32,p,(word *)pTruth,nLeaves,0,0,5,4,&R,&Func0,&local_50,(word *)0x0,0);
  if (local_32.nVars != '\0') {
    Func0 = If_CluAdjust(Func0,(int)R.nVars);
    t = If_CluAdjust(local_50,(int)local_32.nVars);
    iVar2 = 1;
    if ('\x04' < local_32.nVars) {
      pIVar1 = p->pPars;
      if ((pIVar1->fEnableCheck75 != 0) && (iVar2 = If_CluCheckDecOut(t,5), iVar2 != 0)) {
        return 1;
      }
      if ((pIVar1->fEnableCheck75u != 0) && (iVar2 = If_CluCheckDecOutU(t,5), iVar2 != 0)) {
        return 1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int If_CutPerformCheck45( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{    
    // 5LUT -> 4LUT
    If_Grp_t G, R;
    word Func0, Func1;
    G = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, 5, 4, &R, &Func0, &Func1, NULL, 0 );
    if ( G.nVars == 0 )
        return 0;
    Func0 = If_CluAdjust( Func0, R.nVars );
    Func1 = If_CluAdjust( Func1, G.nVars );
#if 0
    Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func0, R.nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func1, G.nVars ); printf( "\n" );
    If_CluPrintGroup( &R );
    If_CluPrintGroup( &G );
#endif
    if ( G.nVars < 5 || (p->pPars->fEnableCheck75 && If_CluCheckDecOut(Func1, 5)) || (p->pPars->fEnableCheck75u && If_CluCheckDecOutU(Func1, 5)) )
        return 1;
    return 0;
}